

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trsort.c
# Opt level: O2

saint_t tr_ilg(saidx64_t n)

{
  if ((ulong)n >> 0x20 != 0) {
    if ((ulong)n >> 0x30 != 0) {
      if ((ulong)n >> 0x38 == 0) {
        return lg_table[(ulong)n >> 0x30] + 0x30;
      }
      return lg_table[(ulong)n >> 0x38] + 0x38;
    }
    if ((ulong)n >> 0x28 == 0) {
      return lg_table[(ulong)n >> 0x20] + 0x20;
    }
    return lg_table[(ulong)n >> 0x28] + 0x28;
  }
  if (0xffff < (ulong)n) {
    if ((ulong)n < 0x1000000) {
      return lg_table[(ulong)n >> 0x10] + 0x10;
    }
    return lg_table[(ulong)n >> 0x18] + 0x18;
  }
  if ((ulong)n < 0x100) {
    return lg_table[n];
  }
  return lg_table[(ulong)n >> 8] + 8;
}

Assistant:

static INLINE
saint_t
tr_ilg(saidx_t n) {
#if defined(BUILD_DIVSUFSORT64)
  return (n >> 32) ?
          ((n >> 48) ?
            ((n >> 56) ?
              56 + lg_table[(n >> 56) & 0xff] :
              48 + lg_table[(n >> 48) & 0xff]) :
            ((n >> 40) ?
              40 + lg_table[(n >> 40) & 0xff] :
              32 + lg_table[(n >> 32) & 0xff])) :
          ((n & 0xffff0000) ?
            ((n & 0xff000000) ?
              24 + lg_table[(n >> 24) & 0xff] :
              16 + lg_table[(n >> 16) & 0xff]) :
            ((n & 0x0000ff00) ?
               8 + lg_table[(n >>  8) & 0xff] :
               0 + lg_table[(n >>  0) & 0xff]));
#else
  return (n & 0xffff0000) ?
          ((n & 0xff000000) ?
            24 + lg_table[(n >> 24) & 0xff] :
            16 + lg_table[(n >> 16) & 0xff]) :
          ((n & 0x0000ff00) ?
             8 + lg_table[(n >>  8) & 0xff] :
             0 + lg_table[(n >>  0) & 0xff]);
#endif
}